

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-server.c
# Opt level: O1

SshChannel * ssh1_serverside_agent_open(ConnectionLayer *cl,Channel *chan)

{
  LogContext *ctx;
  ssh1_channel *c;
  char *event;
  long lVar1;
  
  c = (ssh1_channel *)safemalloc(1,0x38,0);
  c->connlayer = (ssh1_connection_state *)(cl + -0xe);
  ssh1_channel_init(c);
  c->halfopen = true;
  c->chan = chan;
  ctx = cl[5].logctx;
  event = dupprintf("Forwarding agent connection to client");
  logevent_and_free(ctx,event);
  lVar1 = (**(code **)((cl[1].vt)->rportfwd_alloc + 0x18))(0x1f);
  BinarySink_put_uint32((BinarySink *)(lVar1 + 0x60),(ulong)c->localid);
  pq_base_push((PacketQueueBase *)cl[2].vt,(PacketQueueNode *)(lVar1 + 0x40));
  return &c->sc;
}

Assistant:

SshChannel *ssh1_serverside_agent_open(ConnectionLayer *cl, Channel *chan)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    struct ssh1_channel *c = snew(struct ssh1_channel);
    PktOut *pktout;

    c->connlayer = s;
    ssh1_channel_init(c);
    c->halfopen = true;
    c->chan = chan;

    ppl_logevent("Forwarding agent connection to client");

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_AGENT_OPEN);
    put_uint32(pktout, c->localid);
    pq_push(s->ppl.out_pq, pktout);

    return &c->sc;
}